

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O3

void Fxu_MatrixRingVarsUnmark(Fxu_Matrix *p)

{
  Fxu_Var *pFVar1;
  Fxu_Var *pFVar2;
  
  pFVar1 = p->pOrderVars;
  if ((pFVar1 != (Fxu_Var *)0x0) && (pFVar1 != (Fxu_Var *)0x1)) {
    pFVar2 = pFVar1->pOrder;
    pFVar1->pOrder = (Fxu_Var *)0x0;
    while (pFVar2 != (Fxu_Var *)0x1) {
      pFVar1 = pFVar2->pOrder;
      pFVar2->pOrder = (Fxu_Var *)0x0;
      pFVar2 = pFVar1;
    }
  }
  p->pOrderVars = (Fxu_Var *)0x0;
  p->ppTailVars = (Fxu_Var **)0x0;
  return;
}

Assistant:

void Fxu_MatrixRingVarsUnmark( Fxu_Matrix * p )
{
    Fxu_Var * pVar, * pVar2;
    // unmark the vars
    Fxu_MatrixForEachVarInRingSafe( p, pVar, pVar2 )
        pVar->pOrder = NULL;
    Fxu_MatrixRingVarsReset( p );
}